

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldst_helper.c
# Opt level: O2

void do_check_align(CPUSPARCState_conflict1 *env,target_ulong addr,uint32_t align,uintptr_t ra)

{
  if ((align & (uint)addr) == 0) {
    return;
  }
  cpu_raise_exception_ra_sparc64(env,0x34,ra);
}

Assistant:

static void do_check_align(CPUSPARCState *env, target_ulong addr,
                           uint32_t align, uintptr_t ra)
{
    if (addr & align) {
#ifdef DEBUG_UNALIGNED
        printf("Unaligned access to 0x" TARGET_FMT_lx " from 0x" TARGET_FMT_lx
               "\n", addr, env->pc);
#endif
        cpu_raise_exception_ra(env, TT_UNALIGNED, ra);
    }
}